

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::sum(Node *__return_storage_ptr__,Parser *this)

{
  vector<Node,_std::allocator<Node>_> *this_00;
  lexemtype lVar1;
  pointer pcVar2;
  Node tNode;
  string local_168;
  ifstream *local_148;
  Lexer *local_140;
  string *local_138;
  Node local_130;
  Node local_f0;
  Node local_b0;
  Node local_70;
  
  term(__return_storage_ptr__,this);
  local_138 = (string *)&__return_storage_ptr__->value;
  this_00 = &__return_storage_ptr__->subnodes;
  local_140 = &this->lexer;
  local_148 = &this->fin;
  while (lVar1 = (this->lexer).lexem.type, lVar1 - PLUS < 4) {
    Node::Node(&local_f0,__return_storage_ptr__);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    pcVar2 = (this->lexer).lexem.value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar2,pcVar2 + (this->lexer).lexem.value._M_string_length);
    Node::Node(&local_130,lVar1 - SEMICOLON,&local_168);
    __return_storage_ptr__->_if = local_130._if;
    __return_storage_ptr__->_else = local_130._else;
    __return_storage_ptr__->kind = local_130.kind;
    std::__cxx11::string::_M_assign(local_138);
    std::vector<Node,_std::allocator<Node>_>::operator=(this_00,&local_130.subnodes);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_130.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.value._M_dataplus._M_p != &local_130.value.field_2) {
      operator_delete(local_130.value._M_dataplus._M_p,
                      local_130.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    Lexer::nextLexem(local_140,local_148);
    Node::Node(&local_70,&local_f0);
    std::vector<Node,_std::allocator<Node>_>::push_back(this_00,&local_70);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_70.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
      operator_delete(local_70.value._M_dataplus._M_p,
                      local_70.value.field_2._M_allocated_capacity + 1);
    }
    term(&local_b0,this);
    std::vector<Node,_std::allocator<Node>_>::push_back(this_00,&local_b0);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_b0.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
      operator_delete(local_b0.value._M_dataplus._M_p,
                      local_b0.value.field_2._M_allocated_capacity + 1);
    }
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_f0.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.value._M_dataplus._M_p != &local_f0.value.field_2) {
      operator_delete(local_f0.value._M_dataplus._M_p,
                      local_f0.value.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::sum() {
    Node termNode = term(); // sumNode = var
    nodekind kind;
    while (getLexemType() == PLUS || getLexemType() == MINUS || getLexemType() == MULTIPLICATION
           || getLexemType() == DIVISION) {
        switch (getLexemType()) {
            case PLUS:
                kind = ADD;
                break;
            case MINUS:
                kind = SUB;
                break;
            case MULTIPLICATION:
                kind = MUL;
                break;
            case DIVISION:
                kind = DIV;
                break;
        }
        Node tNode = Node(termNode);
        termNode = Node(kind, getLexemValue());
        nextLexem();
        termNode.addSubnode(tNode);
        termNode.addSubnode(term());
    }
    return termNode;
}